

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

pair<kitty::static_truth_table<5U,_true>,_bool> __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>>::
run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
          (miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>> *this,
          _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
          *fn)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  undefined7 extraout_var;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_type __n;
  pair<kitty::static_truth_table<5U,_true>,_bool> pVar11;
  static_truth_table<5U,_true> tt;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  value_type_conflict3 local_2c;
  
  iVar1 = *(int *)(this + 8);
  __n = 1L << ((byte)iVar1 & 0x3f);
  local_2c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,__n,&local_2c,&local_49);
  if (iVar1 != 0) {
    puVar6 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    uVar10 = (uint)__n;
    if (uVar10 < 3) {
      uVar10 = 2;
    }
    uVar4 = iVar1 + 1U;
    if (iVar1 + 1U < 3) {
      uVar4 = 2;
    }
    uVar7 = 1;
    do {
      uVar8 = 1;
      do {
        uVar9 = uVar8 - (uVar8 >> 1 & 0x55555555);
        uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
        if (((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18 == uVar7) {
          *puVar6 = uVar8;
          puVar6 = puVar6 + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  pvVar2 = *(void **)(this + 0x78);
  lVar3 = *(long *)(this + 0x88);
  *(pointer *)(this + 0x78) =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x80) =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x88) =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,lVar3 - (long)pvVar2);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  bVar5 = miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::normalize
                    ((miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *)this
                    );
  (*fn)((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
         *)(this + 0xa8));
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spectrum::to_truth_table<kitty::static_truth_table<5u,true>>
            ((spectrum *)(this + 0x10),(static_truth_table<5U,_true> *)&local_48);
  pVar11._8_8_ = CONCAT71(extraout_var,bVar5) & 0xffffffff;
  pVar11.first._bits =
       (uint64_t)
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return pVar11;
}

Assistant:

std::pair<TT, bool> run( Callback&& fn )
  {
    order = get_rw_coeffecient_order( num_vars );
    const auto exact = normalize();

    fn( best_transforms );

    TT tt = func.construct();
    spec.to_truth_table<TT>( tt );
    return { tt, exact };
  }